

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Gia_ManPrepareLastTwo(Gia_Man_t *pNew,Vec_Int_t *vSuper)

{
  uint uVar1;
  uint iLit0;
  uint iLit1;
  Vec_Int_t *pVVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int local_64;
  ulong uVar14;
  
  iVar13 = vSuper->nSize;
  if (iVar13 != 2) {
    if (iVar13 < 3) {
      __assert_fail("nSize > 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaBalAig.c"
                    ,0xe8,"void Gia_ManPrepareLastTwo(Gia_Man_t *, Vec_Int_t *)");
    }
    uVar1 = iVar13 - 2;
    if (vSuper->pArray[uVar1] < 0) {
LAB_00708239:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar7 = (uint)vSuper->pArray[uVar1] >> 1;
    pVVar2 = pNew->vLevels;
    Vec_IntFillExtra(pVVar2,uVar7 + 1,0);
    if (pVVar2->nSize <= (int)uVar7) {
LAB_0070821a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar9 = pVVar2->pArray[uVar7];
    uVar7 = iVar13 - 3U;
    do {
      if (vSuper->nSize <= (int)uVar7) goto LAB_0070821a;
      if (vSuper->pArray[uVar7] < 0) goto LAB_00708239;
      uVar8 = (uint)vSuper->pArray[uVar7] >> 1;
      pVVar2 = pNew->vLevels;
      Vec_IntFillExtra(pVVar2,uVar8 + 1,0);
      if (pVVar2->nSize <= (int)uVar8) goto LAB_0070821a;
      if (iVar9 != pVVar2->pArray[uVar8]) goto LAB_007080f5;
      bVar3 = 0 < (int)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar3);
    uVar7 = 0xffffffff;
LAB_007080f5:
    if (uVar7 != iVar13 - 3U) {
      uVar8 = iVar13 - 9U;
      if ((int)(iVar13 - 9U) < (int)uVar7) {
        uVar8 = uVar7;
      }
      uVar12 = iVar13 - 1;
      uVar14 = (ulong)uVar12;
      if ((int)uVar7 < (int)uVar12) {
        local_64 = 0;
        uVar11 = uVar14;
        do {
          uVar7 = (uint)uVar11;
          uVar4 = uVar7 - 1;
          if ((int)uVar8 < (int)uVar4) {
            uVar10 = uVar11;
            iVar13 = local_64;
            if ((int)uVar7 < 0) goto LAB_0070821a;
            do {
              if (((vSuper->nSize <= (int)uVar7) || (iVar9 = (int)uVar10, iVar9 < 1)) ||
                 (uVar10 = (ulong)(iVar9 - 1U), (uint)vSuper->nSize <= iVar9 - 1U))
              goto LAB_0070821a;
              piVar6 = vSuper->pArray;
              iLit0 = piVar6[uVar11];
              if (((int)iLit0 < 0) || (iLit1 = piVar6[uVar10], (int)iLit1 < 0)) goto LAB_00708239;
              if ((iLit1 ^ iLit0) < 2) {
LAB_007081b7:
                if (uVar7 != uVar12) {
                  iVar5 = piVar6[uVar11];
                  piVar6[uVar11] = piVar6[uVar14];
                  piVar6[uVar14] = iVar5;
                }
                if (iVar13 != 0) {
                  iVar5 = piVar6[uVar10];
                  piVar6[uVar10] = piVar6[uVar1];
                  piVar6[uVar1] = iVar5;
                }
              }
              else {
                iVar5 = Gia_ManHashLookupInt(pNew,iLit0,iLit1);
                if (iVar5 != 0) {
                  piVar6 = vSuper->pArray;
                  goto LAB_007081b7;
                }
              }
              iVar13 = iVar13 + 1;
            } while ((int)uVar8 < iVar9 + -2);
          }
          local_64 = local_64 + 1;
          uVar11 = (ulong)uVar4;
        } while ((int)uVar8 < (int)uVar4);
      }
    }
  }
  return;
}

Assistant:

void Gia_ManPrepareLastTwo( Gia_Man_t * pNew, Vec_Int_t * vSuper )
{
    int i, k, Stop, Lit1, Lit2, Level1, Level2, * pArray;
    int nSize = Vec_IntSize(vSuper);
    if ( nSize == 2 )
        return;
    assert( nSize > 2 );
    Level1 = Gia_ObjLevelId( pNew, Abc_Lit2Var(Vec_IntEntry(vSuper, nSize-2)) );
    // find the first one with Level1
    for ( Stop = nSize-3; Stop >= 0; Stop-- )
    {
        Level2 = Gia_ObjLevelId( pNew, Abc_Lit2Var(Vec_IntEntry(vSuper, Stop)) );
        if ( Level1 != Level2 )
            break;
    }
    if ( Stop == nSize-3 )
        return;
    // avoid worst-case quadratic behavior by looking at the last 8 nodes
    Stop = Abc_MaxInt( Stop, nSize - 9 );
    for ( i = nSize - 1; i > Stop; i-- )
        for ( k = i - 1; k > Stop; k-- )
        {
            Lit1 = Vec_IntEntry(vSuper, i);
            Lit2 = Vec_IntEntry(vSuper, k);
            if ( Abc_Lit2Var(Lit1) != Abc_Lit2Var(Lit2) && !Gia_ManHashLookupInt(pNew, Lit1, Lit2) ) // new node
                continue;
            // move Lit1 to be last and Lit2 to be the one before
            pArray = Vec_IntArray( vSuper );
            if ( i != nSize-1 )
                ABC_SWAP( int, pArray[i], pArray[nSize-1] );
            if ( k != nSize-2 )
                ABC_SWAP( int, pArray[k], pArray[nSize-2] );
        }
}